

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Node<int,QList<int>>::emplaceValue<QList<int>>
          (Node<int,QList<int>> *this,QList<int> *args)

{
  long in_FS_OFFSET;
  QArrayDataPointer<int> local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.d = (args->d).d;
  local_28.ptr = (args->d).ptr;
  (args->d).d = (Data *)0x0;
  (args->d).ptr = (int *)0x0;
  local_28.size = (args->d).size;
  (args->d).size = 0;
  QArrayDataPointer<int>::operator=((QArrayDataPointer<int> *)(this + 8),&local_28);
  if (&(local_28.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_28.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_28.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_28.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_28.d)->super_QArrayData,4,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplaceValue(Args &&... args)
    {
        value = T(std::forward<Args>(args)...);
    }